

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O2

exr_result_t
write_tile_chunk(exr_context_t ctxt,int part_index,exr_priv_part_t part,int tilex,int tiley,
                int levelx,int levely,void *packed_data,uint64_t packed_size,uint64_t unpacked_size,
                void *sample_data,uint64_t sample_data_size)

{
  uint64_t *puVar1;
  exr_storage_t eVar2;
  uint uVar3;
  uint64_t uVar4;
  exr_result_t eVar5;
  int iVar6;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE_00;
  ulong uVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  exr_result_t eStack_b0;
  int cidx;
  void *local_90;
  uint64_t local_88;
  uint64_t local_80;
  void *local_78;
  uint64_t *ctable;
  int32_t data [6];
  int64_t ddata [3];
  
  if (ctxt->mode == '\x03') {
    eVar2 = part->storage_mode;
    if ((eVar2 & ~EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_SCANLINE) {
      UNRECOVERED_JUMPTABLE_00 = ctxt->standard_error;
      eStack_b0 = 0x13;
    }
    else {
      if (ctxt->cur_output_part == part_index) {
        if (packed_data == (void *)0x0 || packed_size == 0) {
          UNRECOVERED_JUMPTABLE = ctxt->print_error;
          pcVar9 = "Invalid packed data argument size %lu pointer %p";
          sample_data_size = packed_size;
          sample_data = packed_data;
        }
        else if (packed_size >> 0x1f == 0 || eVar2 == EXR_STORAGE_DEEP_TILED) {
          if ((eVar2 != EXR_STORAGE_DEEP_TILED) ||
             (sample_data != (void *)0x0 && sample_data_size != 0)) {
            local_88 = unpacked_size;
            local_90 = sample_data;
            local_80 = sample_data_size;
            local_78 = packed_data;
            cidx = -1;
            eVar5 = validate_and_compute_tile_chunk_off(ctxt,part,tilex,tiley,levelx,levely,&cidx);
            iVar6 = cidx;
            if (eVar5 == 0) {
              uVar11 = (ulong)(uint)cidx;
              if (cidx < 0 || part->chunk_count <= cidx) {
                eVar5 = (*ctxt->print_error)
                                  (ctxt,3,
                                   "Chunk index for tile (%d, %d) at level (%d, %d) %d outside chunk count %d"
                                   ,(ulong)(uint)tilex,(ulong)(uint)tiley,levelx,(ulong)(uint)levely
                                   ,uVar11,(ulong)(uint)part->chunk_count);
              }
              else {
                if ((part->lineorder != EXR_LINEORDER_RANDOM_Y) &&
                   (ctxt->last_output_chunk != cidx - 1U)) {
                  eVar5 = (*ctxt->print_error)
                                    (ctxt,0x1a,
                                     "Chunk index %d is not the next chunk to be written (last %d)",
                                     (ulong)(uint)cidx,(ulong)(uint)ctxt->last_output_chunk,
                                     ctxt->print_error);
                  return eVar5;
                }
                bVar13 = ctxt->is_multipart != '\0';
                if (bVar13) {
                  data[0] = part_index;
                }
                uVar3 = (uint)bVar13;
                uVar7 = (ulong)(uVar3 * 4);
                *(int *)((long)data + uVar7) = tilex;
                *(int *)((long)data + uVar7 + 4) = tiley;
                data[(ulong)bVar13 + 2] = levelx;
                uVar12 = uVar3 + 4;
                *(int *)((long)data + uVar7 + 0xc) = levely;
                if (part->storage_mode != EXR_STORAGE_DEEP_TILED) {
                  data[uVar12] = (int32_t)packed_size;
                  uVar12 = uVar3 + 5;
                }
                eVar5 = alloc_chunk_table(ctxt,part,&ctable);
                if (eVar5 == 0) {
                  puVar1 = &ctxt->output_file_offset;
                  ctable[uVar11] = ctxt->output_file_offset;
                  eVar5 = (*ctxt->do_write)(ctxt,data,(ulong)(uVar12 << 2),puVar1);
                  uVar4 = local_80;
                  if (eVar5 == 0) {
                    if (part->storage_mode == EXR_STORAGE_DEEP_TILED) {
                      ddata[0] = local_80;
                      ddata[1] = packed_size;
                      ddata[2] = local_88;
                      eVar5 = (*ctxt->do_write)(ctxt,ddata,0x18,puVar1);
                      if (eVar5 != 0) {
                        return eVar5;
                      }
                      eVar5 = (*ctxt->do_write)(ctxt,local_90,uVar4,puVar1);
                      if (eVar5 != 0) {
                        return eVar5;
                      }
                    }
                    eVar5 = (*ctxt->do_write)(ctxt,local_78,packed_size,puVar1);
                    if (eVar5 == 0) {
                      lVar10 = (long)ctxt->output_chunk_count + 1;
                      iVar8 = (int)lVar10;
                      ctxt->output_chunk_count = iVar8;
                      if (iVar8 == part->chunk_count) {
                        ddata[0] = part->chunk_table_offset;
                        iVar6 = ctxt->cur_output_part + 1;
                        ctxt->cur_output_part = iVar6;
                        if (iVar6 == ctxt->num_parts) {
                          ctxt->mode = '\x05';
                        }
                        ctxt->last_output_chunk = -1;
                        ctxt->output_chunk_count = 0;
                        eVar5 = (*ctxt->do_write)(ctxt,ctable,lVar10 * 8,(uint64_t *)ddata);
                      }
                      else {
                        ctxt->last_output_chunk = iVar6;
                        eVar5 = 0;
                      }
                    }
                  }
                }
              }
            }
            return eVar5;
          }
          UNRECOVERED_JUMPTABLE = ctxt->print_error;
          pcVar9 = "Invalid sample count data argument size %lu pointer %p";
        }
        else {
          UNRECOVERED_JUMPTABLE = ctxt->print_error;
          pcVar9 = "Packed data size %lu too large (max %lu)";
          sample_data = (void *)0x7fffffff;
          sample_data_size = packed_size;
        }
        eVar5 = (*UNRECOVERED_JUMPTABLE)
                          (ctxt,3,pcVar9,sample_data_size,sample_data,UNRECOVERED_JUMPTABLE);
        return eVar5;
      }
      UNRECOVERED_JUMPTABLE_00 = ctxt->standard_error;
      eStack_b0 = 0x19;
    }
  }
  else if (ctxt->mode == '\x01') {
    UNRECOVERED_JUMPTABLE_00 = ctxt->standard_error;
    eStack_b0 = 9;
  }
  else {
    UNRECOVERED_JUMPTABLE_00 = ctxt->standard_error;
    eStack_b0 = 8;
  }
  eVar5 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,eStack_b0);
  return eVar5;
}

Assistant:

static exr_result_t
write_tile_chunk (
    exr_context_t   ctxt,
    int             part_index,
    exr_priv_part_t part,
    int             tilex,
    int             tiley,
    int             levelx,
    int             levely,
    const void*     packed_data,
    uint64_t        packed_size,
    uint64_t        unpacked_size,
    const void*     sample_data,
    uint64_t        sample_data_size)
{
    exr_result_t rv;
    int32_t      data[6];
    int32_t      psize;
    int          cidx, wrcnt;
    uint64_t*    ctable;

    if (ctxt->mode != EXR_CONTEXT_WRITING_DATA)
    {
        if (ctxt->mode == EXR_CONTEXT_WRITE)
            return ctxt->standard_error (ctxt, EXR_ERR_HEADER_NOT_WRITTEN);
        return ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE);
    }

    if (part->storage_mode == EXR_STORAGE_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        return ctxt->standard_error (ctxt, EXR_ERR_TILE_SCAN_MIXEDAPI);
    }

    if (ctxt->cur_output_part != part_index)
        return ctxt->standard_error (ctxt, EXR_ERR_INCORRECT_PART);

    if (!packed_data || packed_size == 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid packed data argument size %" PRIu64 " pointer %p",
            (uint64_t) packed_size,
            packed_data);

    if (part->storage_mode != EXR_STORAGE_DEEP_TILED &&
        packed_size > (uint64_t) INT32_MAX)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Packed data size %" PRIu64 " too large (max %" PRIu64 ")",
            (uint64_t) packed_size,
            (uint64_t) INT32_MAX);
    psize = (int32_t) packed_size;

    if (part->storage_mode == EXR_STORAGE_DEEP_TILED &&
        (!sample_data || sample_data_size == 0))
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid sample count data argument size %" PRIu64 " pointer %p",
            (uint64_t) sample_data_size,
            sample_data);

    cidx = -1;
    rv   = validate_and_compute_tile_chunk_off (
        ctxt, part, tilex, tiley, levelx, levely, &cidx);
    if (rv != EXR_ERR_SUCCESS) return rv;

    if (cidx < 0 || cidx >= part->chunk_count)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Chunk index for tile (%d, %d) at level (%d, %d) %d outside chunk count %d",
            tilex,
            tiley,
            levelx,
            levely,
            cidx,
            part->chunk_count);
    }

    if (part->lineorder != EXR_LINEORDER_RANDOM_Y &&
        ctxt->last_output_chunk != (cidx - 1))
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INCORRECT_CHUNK,
            "Chunk index %d is not the next chunk to be written (last %d)",
            cidx,
            ctxt->last_output_chunk);
    }

    wrcnt = 0;
    if (ctxt->is_multipart) { data[wrcnt++] = part_index; }
    data[wrcnt++] = tilex;
    data[wrcnt++] = tiley;
    data[wrcnt++] = levelx;
    data[wrcnt++] = levely;
    if (part->storage_mode != EXR_STORAGE_DEEP_TILED) data[wrcnt++] = psize;

    priv_from_native32 (data, wrcnt);

    rv = alloc_chunk_table (ctxt, part, &ctable);
    if (rv != EXR_ERR_SUCCESS) return rv;

    ctable[cidx] = ctxt->output_file_offset;
    rv           = ctxt->do_write (
        ctxt,
        data,
        (uint64_t) (wrcnt) * sizeof (int32_t),
        &(ctxt->output_file_offset));
    if (rv == EXR_ERR_SUCCESS && part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        int64_t ddata[3];
        ddata[0] = (int64_t) sample_data_size;
        ddata[1] = (int64_t) packed_size;
        ddata[2] = (int64_t) unpacked_size;

        priv_from_native64 (ddata, 3);

        rv = ctxt->do_write (
            ctxt, ddata, 3 * sizeof (uint64_t), &(ctxt->output_file_offset));

        if (rv == EXR_ERR_SUCCESS)
            rv = ctxt->do_write (
                ctxt,
                sample_data,
                sample_data_size,
                &(ctxt->output_file_offset));
    }
    if (rv == EXR_ERR_SUCCESS)
        rv = ctxt->do_write (
            ctxt, packed_data, packed_size, &(ctxt->output_file_offset));

    if (rv == EXR_ERR_SUCCESS)
    {
        ++(ctxt->output_chunk_count);
        if (ctxt->output_chunk_count == part->chunk_count)
        {
            uint64_t chunkoff = part->chunk_table_offset;

            ++(ctxt->cur_output_part);
            if (ctxt->cur_output_part == ctxt->num_parts)
                ctxt->mode = EXR_CONTEXT_WRITE_FINISHED;
            ctxt->last_output_chunk  = -1;
            ctxt->output_chunk_count = 0;

            priv_from_native64 (ctable, part->chunk_count);
            rv = ctxt->do_write (
                ctxt,
                ctable,
                sizeof (uint64_t) * (uint64_t) (part->chunk_count),
                &chunkoff);
            /* just in case we look at it again? */
            priv_to_native64 (ctable, part->chunk_count);
        }
        else { ctxt->last_output_chunk = cidx; }
    }

    return rv;
}